

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PatternPainter.cpp
# Opt level: O2

void __thiscall
PatternPainter::drawBackground
          (PatternPainter *this,QPainter *p,PatternLayout *l,int ypos,int rowStart,int rows)

{
  int h;
  int x;
  int w;
  int iVar1;
  int iVar2;
  bool bVar3;
  
  h = CellPainter::cellHeight(&this->super_CellPainter);
  x = PatternLayout::patternStart(l);
  w = PatternLayout::rowWidth(l);
  iVar2 = 0;
  if (0 < rows) {
    iVar2 = rows;
  }
  while (bVar3 = iVar2 != 0, iVar2 = iVar2 + -1, bVar3) {
    iVar1 = highlightIndex(this,rowStart);
    QPainter::fillRect(p,x,ypos,w,h,
                       (QColor *)
                       ((long)&(this->mBackgroundColors)._M_elems[0].cspec +
                       (ulong)(uint)(iVar1 << 4)));
    ypos = ypos + h;
    rowStart = rowStart + 1;
  }
  return;
}

Assistant:

void PatternPainter::drawBackground(QPainter &p, PatternLayout const& l, int ypos, int rowStart, int rows) const {
    auto const _cellHeight = cellHeight();

    int rowno = rowStart;
    auto const start = l.patternStart();
    auto const _rowWidth = l.rowWidth();
    for (int i = 0; i < rows; ++i) {
        p.fillRect(start, ypos, _rowWidth, _cellHeight, mBackgroundColors[highlightIndex(rowno)]);
        ypos += _cellHeight;
        ++rowno;
    }
}